

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetDrawTextMask(ON_DimStyle *this,bool bDraw)

{
  ON_TextMask *__src;
  undefined1 local_40 [8];
  ON_TextMask text_mask;
  bool bDraw_local;
  ON_DimStyle *this_local;
  
  text_mask.m_content_hash.m_digest[0x13] = bDraw;
  __src = TextMask(this);
  memcpy(local_40,__src,0x28);
  ON_TextMask::SetDrawTextMask
            ((ON_TextMask *)local_40,(bool)(text_mask.m_content_hash.m_digest[0x13] & 1));
  Internal_SetTextMask(this,(ON_TextMask *)local_40);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,DrawMask);
  return;
}

Assistant:

void ON_DimStyle::SetDrawTextMask(bool bDraw)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetDrawTextMask(bDraw);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::DrawMask);
}